

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

_Bool ssh_ecdhkex_m_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  ptrlen bytes;
  uint8_t val;
  uint uVar1;
  mp_int *in_RAX;
  mp_int *x_00;
  MontgomeryPoint *B;
  MontgomeryPoint *mp;
  strbuf *buf_o;
  size_t i;
  _func_char_ptr_ssh_kex_ptr *byte;
  mp_int *x;
  mp_int *local_38;
  
  local_38 = in_RAX;
  x_00 = mp_from_bytes_le(remoteKey);
  mp_reduce_mod_2to(x_00,(size_t)(dh[-3].vt)->getkey);
  B = ecc_montgomery_point_new((MontgomeryCurve *)dh[-3].vt[1].free,x_00);
  mp_free(x_00);
  mp = ecc_montgomery_multiply(B,(mp_int *)dh[-2].vt);
  uVar1 = ecc_montgomery_is_identity(mp);
  if (uVar1 == 0) {
    ecc_montgomery_get_affine(mp,&local_38);
    ecc_montgomery_point_free(B);
    ecc_montgomery_point_free(mp);
    buf_o = strbuf_new();
    for (byte = (_func_char_ptr_ssh_kex_ptr *)0x0; byte < (dh[-3].vt)->description; byte = byte + 1)
    {
      val = mp_get_byte(local_38,(size_t)byte);
      BinarySink_put_byte(buf_o->binarysink_,val);
    }
    mp_free(local_38);
    bytes.ptr = buf_o->u;
    bytes.len = buf_o->len;
    local_38 = mp_from_bytes_be(bytes);
    strbuf_free(buf_o);
    BinarySink_put_mp_ssh2(bs->binarysink_,local_38);
    mp_free(local_38);
  }
  else {
    ecc_montgomery_point_free(B);
    ecc_montgomery_point_free(mp);
  }
  return uVar1 == 0;
}

Assistant:

static bool ssh_ecdhkex_m_getkey(ecdh_key *dh, ptrlen remoteKey,
                                 BinarySink *bs)
{
    ecdh_key_m *dhm = container_of(dh, ecdh_key_m, ek);

    mp_int *remote_x = mp_from_bytes_le(remoteKey);

    /* Per RFC 7748 section 5, discard any set bits of the other
     * side's public value beyond the minimum number of bits required
     * to represent all valid values. However, an overlarge value that
     * still fits into the remaining number of bits is accepted, and
     * will be reduced mod p. */
    mp_reduce_mod_2to(remote_x, dhm->curve->fieldBits);

    MontgomeryPoint *remote_p = ecc_montgomery_point_new(
        dhm->curve->m.mc, remote_x);
    mp_free(remote_x);

    MontgomeryPoint *p = ecc_montgomery_multiply(remote_p, dhm->private);

    if (ecc_montgomery_is_identity(p)) {
        ecc_montgomery_point_free(remote_p);
        ecc_montgomery_point_free(p);
        return false;
    }

    mp_int *x;
    ecc_montgomery_get_affine(p, &x);

    ecc_montgomery_point_free(remote_p);
    ecc_montgomery_point_free(p);

    /*
     * Endianness-swap. The Curve25519 algorithm definition assumes
     * you were doing your computation in arrays of 32 little-endian
     * bytes, and now specifies that you take your final one of those
     * and convert it into a bignum in _network_ byte order, i.e.
     * big-endian.
     *
     * In particular, the spec says, you convert the _whole_ 32 bytes
     * into a bignum. That is, on the rare occasions that x has come
     * out with the most significant 8 bits zero, we have to imagine
     * that being represented by a 32-byte string with the last byte
     * being zero, so that has to be converted into an SSH-2 bignum
     * with the _low_ byte zero, i.e. a multiple of 256.
     */
    strbuf *sb = strbuf_new();
    for (size_t i = 0; i < dhm->curve->fieldBytes; ++i)
        put_byte(sb, mp_get_byte(x, i));
    mp_free(x);
    x = mp_from_bytes_be(ptrlen_from_strbuf(sb));
    strbuf_free(sb);
    put_mp_ssh2(bs, x);
    mp_free(x);

    return true;
}